

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O3

void __thiscall
lineage::heuristics::PartitionGraph::
PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (PartitionGraph *this,Data *data,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *edgeLabels)

{
  uint uVar1;
  uint uVar2;
  Value VVar3;
  Value VVar4;
  long lVar5;
  pointer pAVar6;
  pointer pAVar7;
  pointer pVVar8;
  pointer pAVar9;
  iterator __position;
  ulong *puVar10;
  ulong uVar11;
  size_t __new_size;
  pointer puVar12;
  Data *pDVar13;
  ProblemGraph *pPVar14;
  pointer pEVar15;
  Value VVar16;
  pointer pAVar17;
  difference_type __d;
  ulong uVar18;
  ulong uVar19;
  pointer pEVar20;
  ulong *__s;
  ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
  components;
  SubgraphWithCut local_90;
  vector<bool,_std::allocator<bool>_> *local_80;
  value_type local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).multipleEdgesEnabled_ =
       false;
  local_80 = &this->branchingLabels_;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  this->data_ = data;
  (this->partitions_).
  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar14 = data->problemGraph;
  local_90.labels_ = edgeLabels;
  local_90.problemGraph_ = pPVar14;
  local_38 = &this->vertexLabels_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
             (long)(pPVar14->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pPVar14->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  __new_size = andres::graph::
               labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::heuristics::PartitionGraph::PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>(lineage::Data&,std::vector<unsigned_char,std::allocator<unsigned_char>>&)::SubgraphWithCut,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         (&pPVar14->graph_,&local_90,
                          (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )local_78.from_.vector_.
                            super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->vertexLabels_,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78
            );
  if (local_78.from_.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.from_.vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.from_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.from_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->partitions_,__new_size);
  local_90.labels_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  puVar12 = (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar12) {
    do {
      local_78.from_.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((this->partitions_).
                     super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + puVar12[(long)local_90.labels_]);
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_78.from_.vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,&local_90,&local_78);
      local_90.labels_ =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           ((long)&((local_90.labels_)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start + 1);
      puVar12 = (this->vertexLabels_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_90.labels_ <
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)(this->vertexLabels_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar12 >> 3));
  }
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.to_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.to_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.to_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::_M_fill_insert((vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                    *)this,(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                           vertices_.
                           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                   ((long)(this->partitions_).
                          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->partitions_).
                          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
                   &local_78);
  if (local_78.to_.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.to_.vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.to_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.to_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.from_.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.from_.vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.from_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.from_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar13 = this->data_;
  pPVar14 = pDVar13->problemGraph;
  pEVar15 = (pPVar14->graph_).edges_.
            super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar14->graph_).edges_.
      super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar15) {
    uVar19 = 0;
    do {
      VVar3 = pEVar15[uVar19].vertexIndices_[0];
      VVar4 = pEVar15[uVar19].vertexIndices_[1];
      lVar5 = (long)(pPVar14->problem_->nodes).
                    super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                    super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(lVar5 + VVar4 * 0x18);
      uVar2 = *(uint *)(lVar5 + VVar3 * 0x18);
      if (uVar2 != uVar1) {
        VVar16 = VVar3;
        if (uVar1 < uVar2) {
          VVar16 = VVar4;
          VVar4 = VVar3;
        }
        puVar12 = (this->vertexLabels_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pAVar6 = (pointer)puVar12[VVar16];
        pAVar7 = (pointer)puVar12[VVar4];
        if ((this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
            multipleEdgesEnabled_ == true) {
LAB_0013443b:
          __position._M_current =
               (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
               super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_78.from_.vector_.
          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pAVar6;
          local_78.from_.vector_.
          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pAVar7;
          if (__position._M_current ==
              (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
            ::_M_realloc_insert<andres::graph::detail::Edge<true,unsigned_long>>
                      ((vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                        *)&(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                           edges_,__position,(Edge<true,_unsigned_long> *)&local_78);
            pEVar20 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                      super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            (__position._M_current)->vertexIndices_[0] = (Value)pAVar6;
            (__position._M_current)->vertexIndices_[1] = (Value)pAVar7;
            pEVar20 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                      super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pEVar20;
          }
          uVar18 = ((long)pEVar20 -
                    (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                          edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
          andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
          insertAdjacenciesForEdge
                    (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,uVar18);
          pDVar13 = this->data_;
        }
        else {
          pVVar8 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar17 = *(pointer *)&((Adjacencies *)((long)(pVVar8 + (long)pAVar6) + 0x20))->vector_;
          pAVar9 = *(pointer *)((long)(pVVar8 + (long)pAVar6) + 0x28);
          uVar18 = (long)pAVar9 - (long)pAVar17 >> 4;
          while (uVar11 = uVar18, 0 < (long)uVar11) {
            uVar18 = uVar11 >> 1;
            if (*(pointer *)(pAVar17 + uVar18) < pAVar7) {
              pAVar17 = pAVar17 + uVar18 + 1;
              uVar18 = ~uVar18 + uVar11;
            }
          }
          if ((pAVar9 == pAVar17) || ((pointer)pAVar17->vertex_ != pAVar7)) goto LAB_0013443b;
          uVar18 = pAVar17->edge_;
        }
        updateEdgeCost(this,uVar18,
                       -(pDVar13->costs).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar19]);
        pDVar13 = this->data_;
        pPVar14 = pDVar13->problemGraph;
      }
      uVar19 = uVar19 + 1;
      pEVar15 = (pPVar14->graph_).edges_.
                super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)((long)(pPVar14->graph_).edges_.
                                    super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar15 >> 4)
            );
  }
  std::vector<bool,_std::allocator<bool>_>::resize
            (local_80,(long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                            edges_.
                            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                            edges_.
                            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4,false);
  __s = (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar10 = (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (__s != puVar10) {
    memset(__s,0,(long)puVar10 - (long)__s);
    __s = puVar10;
  }
  if (uVar1 != 0) {
    *__s = *__s & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  return;
}

Assistant:

PartitionGraph(Data& data, ELABELS& edgeLabels)
      : data_(data)
    {
        size_t numberOfComponents{ 0 };

        { // construct vertex labels.

            struct SubgraphWithCut
            { // a subgraph with cut mask
                SubgraphWithCut(const ELABELS& labels,
                                const ProblemGraph& problemGraph)
                  : labels_(labels)
                  , problemGraph_(problemGraph)
                {
                }
                bool vertex(const std::size_t v) const { return true; }
                bool edge(const std::size_t e) const
                {
                    if (labels_[e] == 1)
                        return false;

                    const auto v0 = problemGraph_.graph().vertexOfEdge(e, 0);
                    const auto v1 = problemGraph_.graph().vertexOfEdge(e, 1);
                    if (problemGraph_.frameOfNode(v0) !=
                        problemGraph_.frameOfNode(v1))
                        return false;
                    return true;
                }

                const ELABELS& labels_;
                const ProblemGraph& problemGraph_;
            };

            // build decomposition based on the current multicut
            andres::graph::ComponentsBySearch<decltype(
                this->data_.problemGraph.graph())>
                components;
            numberOfComponents = components.build(
                this->data_.problemGraph.graph(),
                SubgraphWithCut(edgeLabels, this->data_.problemGraph));

            vertexLabels_ = components.labels_;
        }

        // construct partitions from initial labeling.
        partitions_.resize(numberOfComponents);
        for (size_t v = 0; v < vertexLabels_.size(); ++v) {
            partitions_[vertexLabels_[v]].insert(v);
        }

        // construct vertices and edges of branching graph.
        this->insertVertices(partitions_.size());

        for (size_t edge = 0; edge < data_.problemGraph.graph().numberOfEdges();
             ++edge) {
            auto v0 = data_.problemGraph.graph().vertexOfEdge(edge, 0);
            auto v1 = data_.problemGraph.graph().vertexOfEdge(edge, 1);

            const auto f0 = data_.problemGraph.frameOfNode(v0);
            const auto f1 = data_.problemGraph.frameOfNode(v1);

            // skip in-frame edges.
            if (f0 == f1) {
                continue;
            }

            if (f0 > f1) {
                std::swap(v0, v1);
            }

            const auto branchingEdgeId =
                this->insertEdge(vertexLabels_[v0], vertexLabels_[v1]);
            updateEdgeCost(branchingEdgeId,
                           -data_.costs[edge]); // negative costs because
                                                // BranchingOptimizer
                                                // *maximizes*
        }

        // initialize with empty branching.
        branchingLabels_.resize(this->numberOfEdges(), false);
        std::fill(branchingLabels_.begin(), branchingLabels_.end(), false);

#ifdef DEBUG
        std::cout << "Constructed partitionGraph:" << std::endl;
        std::cout << "  " << this->numberOfVertices() << " vertices"
                  << std::endl;
        std::cout << "  " << this->numberOfEdges() << " edges" << std::endl;
        std::cout << "  " << this->data_.problemGraph.graph().numberOfEdges()
                  << " original edges." << std::endl;
#endif
    }